

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O3

void __thiscall mau::ProxySession::postNextRead(ProxySession *this,uint8_t *readBuffer)

{
  uint uVar1;
  socket_type sVar2;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar3;
  long lVar4;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:646:9)>
  *op;
  error_category *peVar5;
  base_implementation_type *impl;
  thread_info_base *this_thread;
  long in_FS_OFFSET;
  ptr local_58;
  anon_class_16_2_48e8bdf1 local_40;
  
  (this->SourceAddress).impl_.data_.base.sa_family = 2;
  local_58.h = &local_40;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 2) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 10) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 0xc) = 0;
  *(undefined8 *)((long)&(this->SourceAddress).impl_.data_ + 0x14) = 0;
  pbVar3 = (this->super_DeliveryCommonData).Socket._M_t.
           super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
           ._M_head_impl;
  uVar1 = (this->super_DeliveryCommonData).ProxyConfig.MaxDatagramBytes;
  lVar4 = *(long *)&(pbVar3->
                    super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                    ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>;
  impl = (base_implementation_type *)
         ((long)&(pbVar3->
                 super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
                 super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> + 8);
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    this_thread = (thread_info_base *)0x0;
  }
  else {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_40.this = this;
  local_40.readBuffer = readBuffer;
  op = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:646:9)>
        *)asio::detail::thread_info_base::allocate(this_thread,0x70);
  sVar2 = impl->socket_;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.func_ =
       asio::detail::
       reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:646:9)>
       ::do_complete;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.task_result_ = 0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.ec_._M_value = 0;
  local_58.v = op;
  peVar5 = (error_category *)std::_V2::system_category();
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.ec_._M_cat = peVar5;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.bytes_transferred_ = 0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.perform_func_ =
       asio::detail::
       reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
       ::do_perform;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).socket_ = sVar2;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).protocol_type_ = 2;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.data_ = readBuffer + 0x1c;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.size_ = (ulong)uVar1;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).sender_endpoint_ = &this->SourceAddress;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).flags_ = 0;
  (op->handler_).this = local_40.this;
  (op->handler_).readBuffer = local_40.readBuffer;
  local_58.p = op;
  asio::detail::reactive_socket_service_base::start_op
            ((reactive_socket_service_base *)(lVar4 + 0x28),impl,0,(reactor_op *)op,false,true,false
            );
  local_58.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:646:9)>
                *)0x0;
  local_58.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:646:9)>
                *)0x0;
  asio::detail::
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:646:9)>
  ::ptr::reset(&local_58);
  return;
}

Assistant:

void ProxySession::postNextRead(uint8_t* readBuffer)
{
    // Clear source address to allow us to check if it's filled later
    // during error handling
    SourceAddress = UDPAddress();

    // Dispatch asynchronous recvfrom()
    Socket->async_receive_from(
        asio::buffer(readBuffer + kQueueHeaderSize, ProxyConfig.MaxDatagramBytes),
        SourceAddress,
        [this, readBuffer](const asio::error_code& error, size_t bytes_transferred)
    {
        uint8_t* nextReadBuffer = readBuffer;

        // If there was an error reported:
        if (error)
        {
            std::string fromStr = "unrecognized";

            // If no source address was provided:
            if (SourceAddress.address().is_unspecified())
            {
                Logger.Warning("Socket broken based on recvfrom with no source address: ", error.message());
                LastResult = Mau_NetworkFailed;
                return; // Stop here
            }

            // Otherwise we assume it is due to ICMP message from a peer:

            if (SourceAddress == ClientAddress.Get())
            {
                Logger.Debug("recvfrom failed (ICMP from client): ", error.message());
                ClientAddress.Set(UDPAddress());
            }
            else if (SourceAddress == ServerAddress.Get())
            {
                Logger.Debug("recvfrom failed (ICMP from server): ", error.message());
                ClientAddress.Set(UDPAddress());
            }
            else {
                Logger.Debug("recvfrom failed (ICMP unrecognized source): ", error.message());
            }

            // Otherwise we assume it is due to ICMP message from a peer.
            // Fall-thru to continue reading datagrams
        }
        else if (bytes_transferred <= 0)
        {
            Logger.Warning("Socket closed");
            LastResult = Mau_NetworkFailed;
            return; // Stop here
        }
        else if (!Terminated)
        {
            MAU_DEBUG_ASSERT(bytes_transferred <= ProxyConfig.MaxDatagramBytes);

            QueueNode* queueNode = reinterpret_cast<QueueNode*>(readBuffer);
            queueNode->Bytes = static_cast<unsigned>(bytes_transferred);

            if (SourceAddress == ServerAddress.Get())
            {
                S2C.InsertQueueNode(queueNode);
                nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
            }
            else
            {
                const UDPAddress clientAddress = ClientAddress.Get();

                if (clientAddress.address().is_unspecified())
                {
                    ClientAddress.Set(SourceAddress);
                    S2C.SetDeliveryAddress(SourceAddress);

                    C2S.InsertQueueNode(queueNode);
                    nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);

                    Logger.Info("Set client address to ", SourceAddress.address().to_string(), " : ", SourceAddress.port());
                }
                else if (SourceAddress == clientAddress)
                {
                    C2S.InsertQueueNode(queueNode);
                    nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
                }
                else {
                    Logger.Warning("Ignored data from unrecognized source address ", SourceAddress.address().to_string(), " : ", SourceAddress.port());
                }
            }
        }

        // Post next read buffer
        postNextRead(nextReadBuffer);
    });
}